

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O1

void __thiscall
helics::FederateState::FederateState(FederateState *this,string *fedName,CoreFederateInfo *fedInfo)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  pointer ppVar3;
  pointer ppVar4;
  pointer ppVar5;
  TimeCoordinator *this_00;
  pair<int,_TimeRepresentation<count_time<9,_long>_>_> *prop;
  pointer ppVar6;
  pointer ppVar7;
  pointer ppVar8;
  vector<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
  *__range1;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  pcVar2 = (fedName->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar2,pcVar2 + fedName->_M_string_length);
  this_00 = (TimeCoordinator *)operator_new(0x268);
  local_78._8_8_ = 0;
  pcStack_60 = std::
               _Function_handler<void_(const_helics::ActionMessage_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/FederateState.cpp:112:35)>
               ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(const_helics::ActionMessage_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/FederateState.cpp:112:35)>
             ::_M_manager;
  local_78._M_unused._M_object = this;
  TimeCoordinator::TimeCoordinator
            (this_00,(function<void_(const_helics::ActionMessage_&)> *)&local_78);
  (this->timeCoord)._M_t.
  super___uniq_ptr_impl<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>._M_t
  .super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>.
  super__Head_base<0UL,_helics::TimeCoordinator_*,_false>._M_head_impl = this_00;
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  this->local_id = -2000000000;
  this->global_id = (GlobalFederateId)0x8831d580;
  this->state = CREATED;
  this->only_transmit_on_change = false;
  this->realtime = false;
  this->observer = false;
  this->reentrant = false;
  this->mSourceOnly = false;
  this->mCallbackBased = false;
  this->strict_input_type_checking = false;
  this->ignore_unit_mismatch = false;
  this->mSlowResponding = false;
  this->mAllowRemoteControl = true;
  InterfaceInfo::InterfaceInfo(&this->interfaceInformation);
  std::make_unique<helics::LogManager>();
  this->maxLogLevel = -4;
  (this->init_transmitted)._M_base._M_i = false;
  this->mParent = (CommonCore *)0x0;
  this->errorCode = 0;
  this->indexGroup = 0;
  this->wait_for_current_time = false;
  this->ignore_time_mismatch_warnings = false;
  this->mProfilerActive = false;
  this->mLocalProfileCapture = false;
  (this->errorString)._M_dataplus._M_p = (pointer)&(this->errorString).field_2;
  (this->errorString)._M_string_length = 0;
  (this->errorString).field_2._M_local_buf[0] = '\0';
  (this->start_clock_time).__d.__r = 0;
  (this->rt_lag).internalTimeCode = 0;
  (this->rt_lead).internalTimeCode = 0;
  (this->grantTimeOutPeriod).internalTimeCode = 0;
  this->realTimeTimerIndex = -1;
  this->grantTimeoutTimeIndex = -1;
  this->mGrantCount = 0;
  this->initRequested = (__atomic_base<bool>)0x0;
  this->requestingMode = (__atomic_base<bool>)0x0;
  this->initIterating = (__atomic_base<bool>)0x0;
  this->iterating = false;
  this->timeGranted_mode = false;
  this->terminate_on_error = false;
  this->lastIterationRequest = NO_ITERATIONS;
  this->timeMethod = DISTRIBUTED;
  memset(&this->mTimer,0,0x90);
  (this->queue).queueEmptyFlag._M_base._M_i = true;
  std::condition_variable::condition_variable(&(this->queue).condition);
  (this->commandQueue).pullElements.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->commandQueue).pullElements.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->commandQueue).pushElements.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->commandQueue).pullElements.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->commandQueue).pushElements.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->commandQueue).pushElements.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->commandQueue).m_pullLock.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->commandQueue).m_pullLock.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  *(undefined8 *)((long)&(this->commandQueue).m_pullLock.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->commandQueue).m_pullLock.super___mutex_base._M_mutex + 0x10) = 0;
  (this->commandQueue).m_pushLock.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->commandQueue).m_pullLock.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->commandQueue).m_pushLock.super___mutex_base._M_mutex + 0x10) = 0;
  (this->commandQueue).m_pushLock.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->commandQueue).m_pushLock.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->commandQueue).m_pushLock.super___mutex_base._M_mutex + 8) = 0;
  (this->commandQueue).queueEmptyFlag._M_base._M_i = true;
  std::condition_variable::condition_variable(&(this->commandQueue).condition);
  (this->interfaceFlags).super___atomic_base<unsigned_short>._M_i = 0;
  p_Var1 = &(this->delayQueues)._M_t._M_impl.super__Rb_tree_header;
  (this->delayQueues)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->delayQueues)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->delayQueues)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->delayQueues)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->delayQueues)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->events).
  super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->events).
  super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->events).
  super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->eventMessages).
  super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->eventMessages).
  super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->eventMessages).
  super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->delayedFederates).
  super__Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->delayedFederates).
  super__Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->delayedFederates).
  super__Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->time_granted).internalTimeCode = -0x7fffffffffffffff;
  (this->allowed_send_time).internalTimeCode = -0x7fffffffffffffff;
  (this->minimumReceiveTime).internalTimeCode = -0x7fffffffffffffff;
  (this->processing).super___atomic_flag_base._M_i = false;
  (this->queryCallbacks).
  super__Vector_base<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->queryCallbacks).
  super__Vector_base<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->queryCallbacks).
  super__Vector_base<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->fedCallbacks).super___shared_ptr<helics::FederateOperator,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->fedCallbacks).super___shared_ptr<helics::FederateOperator,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->tags).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->tags).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->tags).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->queueProcessing)._M_base._M_i = false;
  ppVar3 = (fedInfo->timeProps).
           super__Vector_base<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar6 = (fedInfo->timeProps).
                super__Vector_base<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar6 != ppVar3; ppVar6 = ppVar6 + 1) {
    setProperty(this,ppVar6->first,(Time)(ppVar6->second).internalTimeCode);
  }
  ppVar4 = (fedInfo->intProps).
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (ppVar7 = (fedInfo->intProps).
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                _M_impl.super__Vector_impl_data._M_start; ppVar7 != ppVar4; ppVar7 = ppVar7 + 1) {
    setProperty(this,ppVar7->first,ppVar7->second);
  }
  ppVar5 = (fedInfo->flagProps).
           super__Vector_base<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (ppVar8 = (fedInfo->flagProps).
                super__Vector_base<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>.
                _M_impl.super__Vector_impl_data._M_start; ppVar8 != ppVar5; ppVar8 = ppVar8 + 1) {
    setOptionFlag(this,ppVar8->first,ppVar8->second);
  }
  local_58._8_8_ = 0;
  pcStack_40 = std::
               _Function_handler<void_(helics::ActionMessage_&&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/FederateState.cpp:125:9)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(helics::ActionMessage_&&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/FederateState.cpp:125:9)>
             ::_M_manager;
  local_58._M_unused._M_object = this;
  std::function<void_(helics::ActionMessage_&&)>::operator=
            ((function<void_(helics::ActionMessage_&&)> *)
             &((this->mLogManager)._M_t.
               super___uniq_ptr_impl<helics::LogManager,_std::default_delete<helics::LogManager>_>.
               _M_t.
               super__Tuple_impl<0UL,_helics::LogManager_*,_std::default_delete<helics::LogManager>_>
               .super__Head_base<0UL,_helics::LogManager_*,_false>._M_head_impl)->mTransmit,
             (function<void_(helics::ActionMessage_&&)> *)&local_58);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  this->maxLogLevel =
       (((this->mLogManager)._M_t.
         super___uniq_ptr_impl<helics::LogManager,_std::default_delete<helics::LogManager>_>._M_t.
         super__Tuple_impl<0UL,_helics::LogManager_*,_std::default_delete<helics::LogManager>_>.
         super__Head_base<0UL,_helics::LogManager_*,_false>._M_head_impl)->maxLogLevel).
       super___atomic_base<int>._M_i;
  return;
}

Assistant:

FederateState::FederateState(const std::string& fedName, const CoreFederateInfo& fedInfo):
    name(fedName),
    timeCoord(new TimeCoordinator([this](const ActionMessage& msg) { routeMessage(msg); })),
    global_id{GlobalFederateId()}, mLogManager(std::make_unique<LogManager>())
{
    for (const auto& prop : fedInfo.timeProps) {
        setProperty(prop.first, prop.second);
    }
    for (const auto& prop : fedInfo.intProps) {
        setProperty(prop.first, prop.second);
    }
    for (const auto& prop : fedInfo.flagProps) {
        setOptionFlag(prop.first, prop.second);
    }
    mLogManager->setTransmitCallback(
        [this](ActionMessage&& message) { mParent->addActionMessage(std::move(message)); });
    maxLogLevel = mLogManager->getMaxLevel();
}